

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlNodeCountOnesRealVec(Ssw_Sml_t *p,Vec_Ptr_t *vObjs)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *p_00;
  Aig_Obj_t *pAVar4;
  uint *puVar5;
  int local_40;
  int local_3c;
  int Counter;
  int k;
  int i;
  uint uWord;
  uint *pSims;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vObjs_local;
  Ssw_Sml_t *p_local;
  
  local_40 = 0;
  iVar2 = Vec_PtrSize(vObjs);
  if (iVar2 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    for (Counter = 0; Counter < p->nWordsTotal; Counter = Counter + 1) {
      k = 0;
      for (local_3c = 0; iVar2 = Vec_PtrSize(vObjs), local_3c < iVar2; local_3c = local_3c + 1) {
        p_00 = (Aig_Obj_t *)Vec_PtrEntry(vObjs,local_3c);
        pAVar4 = Aig_Regular(p_00);
        puVar5 = Ssw_ObjSim(p,pAVar4->Id);
        pAVar4 = Aig_Regular(p_00);
        uVar1 = *(ulong *)&pAVar4->field_0x18;
        uVar3 = Aig_IsComplement(p_00);
        if (((uint)(uVar1 >> 3) & 1) == uVar3) {
          uVar3 = puVar5[Counter];
        }
        else {
          uVar3 = puVar5[Counter] ^ 0xffffffff;
        }
        k = uVar3 | k;
      }
      iVar2 = Aig_WordCountOnes(k);
      local_40 = iVar2 + local_40;
    }
    p_local._4_4_ = local_40;
  }
  return p_local._4_4_;
}

Assistant:

int Ssw_SmlNodeCountOnesRealVec( Ssw_Sml_t * p, Vec_Ptr_t * vObjs )
{
    Aig_Obj_t * pObj;
    unsigned * pSims, uWord;
    int i, k, Counter = 0;
    if ( Vec_PtrSize(vObjs) == 0 )
        return 0;
    for ( i = 0; i < p->nWordsTotal; i++ )
    {
        uWord = 0;
        Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, k )
        {
            pSims = Ssw_ObjSim(p, Aig_Regular(pObj)->Id);
            if ( Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) )
                uWord |= ~pSims[i];
            else
                uWord |= pSims[i];
        }
        Counter += Aig_WordCountOnes( uWord );
    }
    return Counter;
}